

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

xmlEntityPtr getEntityDebug(void *ctx,xmlChar *name)

{
  debugContext *ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.getEntity(%s)\n",name);
    ctx_local = (void *)xmlHashLookup(*(undefined8 *)((long)ctx + 8),name);
  }
  else {
    ctx_local = (void *)0x0;
  }
  return (xmlEntityPtr)ctx_local;
}

Assistant:

static xmlEntityPtr
getEntityDebug(void *ctx, const xmlChar *name)
{
    debugContext *ctxt = ctx;

    callbacks++;
    if (quiet)
	return(NULL);
    fprintf(SAXdebug, "SAX.getEntity(%s)\n", name);

    return(xmlHashLookup(ctxt->generalEntities, name));
}